

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsCheckVariablePerLine.cxx
# Opt level: O1

bool __thiscall kws::Parser::CheckVariablePerLine(Parser *this,unsigned_long max)

{
  string *psVar1;
  string *psVar2;
  char *pcVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  char *__s;
  size_t pos;
  long lVar9;
  long *plVar10;
  size_t sVar11;
  size_t sVar12;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar13;
  long *plVar14;
  size_t sVar15;
  char cVar16;
  long lVar17;
  bool bVar18;
  string line_temp;
  char localval [22];
  string line;
  string typeToFind;
  uint local_24c;
  value_type local_230;
  undefined6 *local_1f8;
  undefined6 uStack_1f0;
  undefined2 uStack_1ea;
  undefined6 uStack_1e8;
  undefined2 uStack_1e2;
  long lStack_1e0;
  undefined8 local_1d8;
  unsigned_long local_1d0;
  string local_1c8;
  string local_1a8;
  string local_188;
  undefined1 *local_168 [2];
  undefined1 local_158 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_148;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_140;
  long local_138;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  this->m_TestsDone[0x1a] = true;
  __s = (char *)operator_new__(0xff);
  local_1d0 = max;
  snprintf(__s,0xff,"Variables per line = %ld max",max);
  pcVar3 = (char *)this->m_TestsDescription[0x1a]._M_string_length;
  strlen(__s);
  std::__cxx11::string::_M_replace((ulong)(this->m_TestsDescription + 0x1a),0,pcVar3,(ulong)__s);
  operator_delete__(__s);
  psVar1 = &this->m_BufferNoComment;
  local_148 = &local_90.field_2;
  local_140 = &local_f0.field_2;
  local_1d8 = 0;
  local_138 = 0;
  do {
    std::__cxx11::string::string
              ((string *)local_168,*(char **)((long)&DAT_00197d30 + local_138),
               (allocator *)&local_230);
    std::__cxx11::string::append((char *)local_168);
    for (pos = std::__cxx11::string::find((char *)psVar1,(ulong)local_168[0],0);
        pos != 0xffffffffffffffff;
        pos = std::__cxx11::string::find((char *)psVar1,(ulong)local_168[0],pos + 1)) {
      sVar11 = 1;
      if ((long)pos < 1) {
        sVar11 = pos;
      }
      sVar12 = pos;
      do {
        sVar15 = sVar12;
        sVar12 = sVar11 - 1;
        if ((long)sVar15 < 2) break;
        sVar12 = sVar15 - 1;
      } while ((psVar1->_M_dataplus)._M_p[sVar15 - 1] == ' ');
      if (((long)sVar15 < 2) || ((psVar1->_M_dataplus)._M_p[sVar12] == '\n')) {
        lVar9 = GetLineNumber(this,pos,true);
        GetLine_abi_cxx11_(&local_188,this,lVar9 - 1);
        iVar7 = std::__cxx11::string::find((char *)&local_188,0x16b53a,0);
        if (iVar7 != -1) {
          std::__cxx11::string::substr((ulong)&local_230,(ulong)&local_188);
          std::__cxx11::string::operator=((string *)&local_188,(string *)&local_230);
          if ((unsigned_long *)local_230.line != &local_230.number) {
            operator_delete((void *)local_230.line);
          }
        }
        iVar7 = std::__cxx11::string::find((char *)&local_188,0x16b53d,0);
        do {
          if (iVar7 == -1) break;
          iVar8 = std::__cxx11::string::find((char *)&local_188,0x16b540,0);
          if (iVar8 == -1) {
            std::__cxx11::string::substr((ulong)&local_230,(ulong)&local_188);
            std::__cxx11::string::operator=((string *)&local_188,(string *)&local_230);
          }
          else {
            std::__cxx11::string::substr((ulong)&local_230,(ulong)&local_188);
            std::__cxx11::string::substr((ulong)local_50,(ulong)&local_188);
            plVar10 = (long *)std::__cxx11::string::replace
                                        ((ulong)local_50,0,(char *)0x0,local_230.line);
            plVar14 = plVar10 + 2;
            if ((long *)*plVar10 == plVar14) {
              lStack_1e0 = plVar10[3];
              uStack_1e8 = (undefined6)*plVar14;
              uStack_1e2 = (undefined2)((ulong)*plVar14 >> 0x30);
              local_1f8 = &uStack_1e8;
            }
            else {
              uStack_1e8 = (undefined6)*plVar14;
              uStack_1e2 = (undefined2)((ulong)*plVar14 >> 0x30);
              local_1f8 = (undefined6 *)*plVar10;
            }
            uStack_1f0 = (undefined6)plVar10[1];
            uStack_1ea = (undefined2)((ulong)plVar10[1] >> 0x30);
            *plVar10 = (long)plVar14;
            plVar10[1] = 0;
            *(undefined1 *)(plVar10 + 2) = 0;
            std::__cxx11::string::operator=((string *)&local_188,(string *)&local_1f8);
            if (local_1f8 != &uStack_1e8) {
              operator_delete(local_1f8);
            }
            if (local_50[0] != local_40) {
              operator_delete(local_50[0]);
            }
            iVar7 = std::__cxx11::string::find((char *)&local_188,0x16b53d,(long)(iVar7 + 1));
          }
          if ((unsigned_long *)local_230.line != &local_230.number) {
            operator_delete((void *)local_230.line);
          }
        } while (iVar8 != -1);
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
        bVar4 = IsBetweenChars(this,'(',')',pos,false,&local_70);
        if (bVar4) {
LAB_00157c35:
          bVar5 = false;
LAB_00157c37:
          bVar18 = false;
          bVar6 = false;
        }
        else {
          local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"");
          bVar5 = IsBetweenCharsFast(this,'(',')',pos,false,&local_1a8);
          if (bVar5) goto LAB_00157c35;
          local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"");
          bVar5 = IsBetweenChars(this,'<','>',pos,false,&local_90);
          if (bVar5) {
            bVar5 = true;
            goto LAB_00157c37;
          }
          local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"");
          bVar6 = IsBetweenCharsFast(this,'<','>',pos,false,&local_b0);
          bVar6 = !bVar6;
          bVar5 = true;
          bVar18 = true;
        }
        if ((bVar18) &&
           ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2)) {
          operator_delete(local_b0._M_dataplus._M_p);
        }
        if ((bVar5) &&
           ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2)) {
          operator_delete(local_90._M_dataplus._M_p);
        }
        if ((!bVar4) &&
           ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8._M_dataplus._M_p != &local_1a8.field_2)) {
          operator_delete(local_1a8._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p);
        }
        if (bVar6) {
          cVar16 = (char)&local_188;
          sVar11 = std::__cxx11::string::find(cVar16,0x2c);
          if (sVar11 == 0xffffffffffffffff) {
            local_24c = 1;
          }
          else {
            local_24c = 1;
            do {
              pos = std::__cxx11::string::find((char)psVar1,0x2c);
              local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"");
              bVar4 = IsBetweenChars(this,'(',')',pos,false,&local_d0);
              if (bVar4) {
LAB_00157d93:
                bVar5 = false;
LAB_00157d96:
                bVar18 = false;
                bVar6 = false;
              }
              else {
                local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,"");
                bVar5 = IsBetweenCharsFast(this,'(',')',pos,false,&local_1c8);
                if (bVar5) goto LAB_00157d93;
                local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"");
                bVar5 = IsBetweenChars(this,'<','>',pos,false,&local_f0);
                if (bVar5) {
                  bVar5 = true;
                  goto LAB_00157d96;
                }
                local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"");
                bVar6 = IsBetweenCharsFast(this,'<','>',pos,false,&local_110);
                bVar6 = !bVar6;
                bVar5 = true;
                bVar18 = true;
              }
              if ((bVar18) &&
                 ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_110._M_dataplus._M_p != &local_110.field_2)) {
                operator_delete(local_110._M_dataplus._M_p);
              }
              if ((bVar5) &&
                 ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_f0._M_dataplus._M_p != &local_f0.field_2)) {
                operator_delete(local_f0._M_dataplus._M_p);
              }
              if ((!bVar4) &&
                 ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1c8._M_dataplus._M_p != &local_1c8.field_2)) {
                operator_delete(local_1c8._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
                operator_delete(local_d0._M_dataplus._M_p);
              }
              sVar12 = sVar11;
              if (bVar6) {
                do {
                  if ((long)sVar12 < 2) {
                    bVar4 = false;
                    goto LAB_00157eb5;
                  }
                  sVar15 = sVar12 - 1;
                  lVar9 = sVar12 - 1;
                  sVar12 = sVar15;
                } while (local_188._M_dataplus._M_p[lVar9] != '{');
                local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_130,local_188._M_dataplus._M_p,
                           local_188._M_dataplus._M_p +
                           CONCAT44(local_188._M_string_length._4_4_,(int)local_188._M_string_length
                                   ));
                sVar12 = FindClosingChar(this,'{','}',sVar15,false,&local_130);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_130._M_dataplus._M_p != &local_130.field_2) {
                  operator_delete(local_130._M_dataplus._M_p);
                }
                bVar4 = (long)sVar11 < (long)sVar12 || sVar12 == 0xffffffffffffffff;
LAB_00157eb5:
                lVar9 = (long)(int)local_188._M_string_length;
                bVar5 = (long)(sVar11 + 1) < lVar9;
                if ((long)(sVar11 + 1) < lVar9) {
                  lVar17 = sVar11 + 2;
                  do {
                    if ((0x20 < (ulong)(byte)local_188._M_dataplus._M_p[lVar17 + -1]) ||
                       ((0x100002600U >>
                         ((ulong)(byte)local_188._M_dataplus._M_p[lVar17 + -1] & 0x3f) & 1) == 0))
                    break;
                    bVar5 = lVar17 < lVar9;
                    bVar18 = lVar17 != lVar9;
                    lVar17 = lVar17 + 1;
                  } while (bVar18);
                }
                if (!bVar4) {
                  local_24c = local_24c + bVar5;
                }
              }
              sVar11 = std::__cxx11::string::find(cVar16,0x2c);
            } while (sVar11 != 0xffffffffffffffff);
          }
          if (local_1d0 < local_24c) {
            local_1f8 = (undefined6 *)0x0;
            uStack_1f0 = 0;
            uStack_1ea = 0;
            uStack_1e8 = 0;
            local_230.description._M_dataplus._M_p = (pointer)&local_230.description.field_2;
            local_230.description._M_string_length = 0;
            local_230.description.field_2._M_local_buf[0] = '\0';
            local_230.line = GetLineNumber(this,pos,true);
            psVar2 = &local_230.description;
            local_230.number = 0x1a;
            local_230.line2 = local_230.line;
            std::__cxx11::string::_M_replace
                      ((ulong)psVar2,0,(char *)local_230.description._M_string_length,0x178ca1);
            snprintf((char *)&local_1f8,0x16,"%d",(ulong)local_24c);
            std::__cxx11::string::append((char *)psVar2);
            std::__cxx11::string::append((char *)psVar2);
            local_1f8 = (undefined6 *)((ulong)local_1f8 & 0xffffffffffffff00);
            snprintf((char *)&local_1f8,0x16,"%ld",local_1d0);
            std::__cxx11::string::append((char *)psVar2);
            std::__cxx11::string::append((char *)psVar2);
            std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>::push_back
                      (&this->m_ErrorList,&local_230);
            paVar13 = &local_230.description.field_2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_230.description._M_dataplus._M_p != paVar13) {
              operator_delete(local_230.description._M_dataplus._M_p);
              paVar13 = extraout_RAX;
            }
            local_1d8 = CONCAT71((int7)((ulong)paVar13 >> 8),1);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_188._M_dataplus._M_p != &local_188.field_2) {
          operator_delete(local_188._M_dataplus._M_p);
        }
      }
    }
    if (local_168[0] != local_158) {
      operator_delete(local_168[0]);
    }
    local_138 = local_138 + 8;
    if (local_138 == 0x60) {
      return (bool)(~(byte)local_1d8 & 1);
    }
  } while( true );
}

Assistant:

bool Parser::CheckVariablePerLine(unsigned long max)
{
  m_TestsDone[VARIABLEPERLINE] = true;
  constexpr size_t length = 255;
  char* val = new char[length];
  snprintf(val,length,"Variables per line = %ld max",max);
  m_TestsDescription[VARIABLEPERLINE] = val;
  delete [] val;

  // For the moment only standard types are defined.
  // We might be able to do more with finding typedefs
  #define ntypes 12
  const char* types[ntypes] = {"int","unsigned int",
   "char","unsigned char",
   "short","unsigned short",
   "long","unsigned long",
   "float","double","void","long int"};

  bool hasError = false;
  for (auto &type : types) {
    std::string typeToFind = type;
    typeToFind += " ";
    size_t posType = m_BufferNoComment.find(typeToFind,0);
    while(posType != std::string::npos)
      {
      // Check that this is the first word
      bool firstWord = false;
      auto pos = static_cast<long int>(posType);
      pos--;
      while((pos>0) && (m_BufferNoComment[pos]==' '))
        {
        pos--;
        }
      if((pos<=0) || (m_BufferNoComment[pos]=='\n'))
        {
        firstWord = true;
        }

      if(firstWord)
        {
        std::string line = this->GetLine(this->GetLineNumber(posType,true)-1);

        // Check if we have any comments
        int poscom = static_cast<int>(line.find("//",0));
        if(poscom != -1)
          {
          line = line.substr(0,poscom);
          }
        poscom = static_cast<int>(line.find("/*",0));
        while(poscom != -1)
          {
          int poscomend = static_cast<int>(line.find("*/",0));
          if(poscomend == -1)
            {
            line = line.substr(0,poscom);
            break;
            }

          std::string line_temp = line.substr(0,poscom);
          line = line_temp+line.substr(poscomend+2,line.size()-poscomend-2);
          poscom = static_cast<int>(line.find("/*",poscom+1));
          }

        // If we have any '(' in the line we stop
        if( !this->IsBetweenChars( '(', ')', posType, false ) &&
          !this->IsBetweenCharsFast( '(', ')', posType, false ) &&
          !this->IsBetweenChars( '<', '>', posType, false ) &&
          !this->IsBetweenCharsFast( '<', '>', posType, false ))
          {
          // This is a very simple check we count the number of comas
          unsigned int vars = 1;
          pos = static_cast<long int>(line.find(',',0));
          while(pos!=-1)
            {
            posType = m_BufferNoComment.find(',', posType+1);
            if( !this->IsBetweenChars( '(', ')', posType, false ) &&
              !this->IsBetweenCharsFast( '(', ')', posType, false ) &&
              !this->IsBetweenChars( '<', '>', posType, false ) &&
              !this->IsBetweenCharsFast( '<', '>', posType, false ))
              {
              // Check that we are not initializing an array
              bool betweenBraces = false;
              long int openCurly = pos-1;
              while(openCurly>0)
                {
                // Ok we have the opening
                if(line[openCurly] == '{')
                  {
                  long int posClosing = static_cast<long int>(this->FindClosingChar('{','}',openCurly,false,line));
                  if(posClosing == -1
                    || pos<posClosing)
                    {
                    betweenBraces = true;
                    }
                  break;
                  }
                openCurly--;
                }
              // Check if we are not at the end of the line
              bool endofline = true;
              long eof = pos+1;
              while(eof < (int)line.size())
                {
                if(line[eof] != ' ' && line[eof] != '\n'
                   && line[eof] != '\r' && line[eof] != '\t')
                  {
                  endofline = false;
                  break;
                  }
                eof++;
                }

              if(!betweenBraces && !endofline)
                {
                vars++;
                }
              }
            pos = static_cast<long int>(line.find(',',pos+1));
            }

          if(vars > max)
            {
            // len(str(2**64)) == 20 + 1 for +/- + 1  for '\0'
            char localval[22]={0}; //Make an extra large buffer to avoid compiler overflow warnings
            Error error;
            error.line = this->GetLineNumber(posType,true);
            error.line2 = error.line;
            error.number = VARIABLEPERLINE;
            error.description = "Number of variable per line exceed: ";
            snprintf(localval,sizeof(localval),"%d",vars);
            error.description += localval;
            error.description += " (max=";
            localval[0]='\0';
            snprintf(localval,sizeof(localval),"%ld",max);
            error.description += localval;
            error.description += ")";
            m_ErrorList.push_back(error);
            hasError = true;
            }
          }
        }// end firstWord
      posType = m_BufferNoComment.find(typeToFind,posType+1);
      }
  }

  return !hasError;
}